

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O1

int Abc_CommandFraigSweep(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  Abc_Ntk_t *pNtk;
  char *pcVar2;
  uint fVeryVerbose;
  uint fExdc;
  char *pcVar3;
  uint fUseInv;
  uint local_3c;
  
  pNtk = Abc_FrameReadNtk(pAbc);
  fExdc = 0;
  Extra_UtilGetoptReset();
  fUseInv = 1;
  local_3c = 0;
  fVeryVerbose = 0;
  while( true ) {
    while( true ) {
      while( true ) {
        while (iVar1 = Extra_UtilGetopt(argc,argv,"ievwh"), iVar1 == 0x77) {
          fVeryVerbose = fVeryVerbose ^ 1;
        }
        if (0x68 < iVar1) break;
        if (iVar1 == -1) {
          if (pNtk == (Abc_Ntk_t *)0x0) {
            pcVar2 = "Empty network.\n";
          }
          else if (pNtk->ntkType == ABC_NTK_LOGIC) {
            iVar1 = Abc_NtkFraigSweep(pNtk,fUseInv,fExdc,local_3c,fVeryVerbose);
            if (iVar1 != 0) {
              return 0;
            }
            pcVar2 = "Sweeping has failed.\n";
          }
          else if (pNtk->ntkType == ABC_NTK_STRASH) {
            pcVar2 = "Cannot sweep AIGs (use \"fraig\").\n";
          }
          else {
            pcVar2 = "Transform the current network into a logic network.\n";
          }
          iVar1 = -1;
          goto LAB_0025feb6;
        }
        if (iVar1 != 0x65) goto LAB_0025fdc5;
        fExdc = fExdc ^ 1;
      }
      if (iVar1 != 0x76) break;
      local_3c = local_3c ^ 1;
    }
    if (iVar1 != 0x69) break;
    fUseInv = fUseInv ^ 1;
  }
LAB_0025fdc5:
  Abc_Print(-2,"usage: fraig_sweep [-evwh]\n");
  Abc_Print(-2,"\t        performs technology-dependent sweep\n");
  pcVar3 = "yes";
  pcVar2 = "yes";
  if (fExdc == 0) {
    pcVar2 = "no";
  }
  Abc_Print(-2,"\t-e    : toggle functional sweeping using EXDC [default = %s]\n",pcVar2);
  pcVar2 = "yes";
  if (local_3c == 0) {
    pcVar2 = "no";
  }
  Abc_Print(-2,"\t-v    : prints verbose information [default = %s]\n",pcVar2);
  if (fVeryVerbose == 0) {
    pcVar3 = "no";
  }
  Abc_Print(-2,"\t-w    : prints equivalence class information [default = %s]\n",pcVar3);
  pcVar2 = "\t-h    : print the command usage\n";
  iVar1 = -2;
LAB_0025feb6:
  Abc_Print(iVar1,pcVar2);
  return 1;
}

Assistant:

int Abc_CommandFraigSweep( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk = Abc_FrameReadNtk(pAbc);
    int c;
    int fUseInv;
    int fExdc;
    int fVerbose;
    int fVeryVerbose;
    extern int Abc_NtkFraigSweep( Abc_Ntk_t * pNtk, int fUseInv, int fExdc, int fVerbose, int fVeryVerbose );
    // set defaults
    fUseInv   = 1;
    fExdc     = 0;
    fVerbose  = 0;
    fVeryVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "ievwh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'i':
            fUseInv ^= 1;
            break;
        case 'e':
            fExdc ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'w':
            fVeryVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }

    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    if ( Abc_NtkIsStrash(pNtk) )
    {
        Abc_Print( -1, "Cannot sweep AIGs (use \"fraig\").\n" );
        return 1;
    }
    if ( !Abc_NtkIsLogic(pNtk) )
    {
        Abc_Print( -1, "Transform the current network into a logic network.\n" );
        return 1;
    }
    // modify the current network
    if ( !Abc_NtkFraigSweep( pNtk, fUseInv, fExdc, fVerbose, fVeryVerbose ) )
    {
        Abc_Print( -1, "Sweeping has failed.\n" );
        return 1;
    }
    return 0;

usage:
    Abc_Print( -2, "usage: fraig_sweep [-evwh]\n" );
    Abc_Print( -2, "\t        performs technology-dependent sweep\n" );
    Abc_Print( -2, "\t-e    : toggle functional sweeping using EXDC [default = %s]\n", fExdc? "yes": "no" );
    Abc_Print( -2, "\t-v    : prints verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-w    : prints equivalence class information [default = %s]\n", fVeryVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h    : print the command usage\n");
    return 1;
}